

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

CompoundString * __thiscall Js::CompoundString::Clone(CompoundString *this,bool forAppending)

{
  Recycler *alloc;
  CompoundString *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6104351;
  data.filename._0_4_ = 0x245;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                        type.ptr)->javascriptLibrary).ptr)->recycler,(TrackAllocData *)local_48);
  this_00 = (CompoundString *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
  CompoundString(this_00,this,forAppending);
  return this_00;
}

Assistant:

CompoundString *CompoundString::Clone(const bool forAppending)
    {
        return RecyclerNew(GetLibrary()->GetRecycler(), CompoundString, *this, forAppending);
    }